

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O2

void bits_bitmap2items(char *bitmap,lysc_type_bits *type,lysc_type_bitenum_item **items)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  byte bVar6;
  lysc_type_bitenum_item *plVar7;
  lysc_type_bitenum_item *plVar8;
  lysc_type_bitenum_item *plVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  sVar2 = lyplg_type_bits_bitmap_size(type);
  iVar3 = 0;
  sVar4 = 0;
  do {
    if (sVar4 == sVar2) {
      return;
    }
    iVar5 = iVar3 + 8;
    bVar6 = 1;
    for (; iVar1 = iVar5, iVar3 != iVar5; iVar3 = iVar3 + 1) {
      plVar8 = type->bits;
      if ((bitmap[sVar4] & bVar6) != 0) {
        uVar11 = 0;
        plVar9 = plVar8;
        while( true ) {
          if (plVar8 == (lysc_type_bitenum_item *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12._0_4_ = plVar8[-1].field_4;
            uVar12._4_2_ = plVar8[-1].flags;
            uVar12._6_2_ = *(undefined2 *)&plVar8[-1].field_0x26;
          }
          if ((uVar12 <= uVar11) || ((plVar9->field_4).value == iVar3)) break;
          uVar11 = uVar11 + 1;
          plVar9 = plVar9 + 1;
        }
        if (items == (lysc_type_bitenum_item **)0x0) {
          plVar8 = (lysc_type_bitenum_item *)0x0;
          plVar7 = _DAT_fffffffffffffff8;
        }
        else {
          plVar8 = items[-1];
          plVar7 = plVar8;
        }
        items[(long)plVar8] = plVar9;
        items[-1] = (lysc_type_bitenum_item *)((long)&plVar7->name + 1);
        plVar8 = type->bits;
      }
      lVar10 = -1;
      if (plVar8 != (lysc_type_bitenum_item *)0x0) {
        lVar10 = *(long *)&plVar8[-1].field_4 + -1;
      }
      iVar1 = iVar3;
      if (iVar3 == plVar8[lVar10].field_4.value) break;
      bVar6 = bVar6 * '\x02';
    }
    iVar3 = iVar1;
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

static void
bits_bitmap2items(const char *bitmap, struct lysc_type_bits *type, struct lysc_type_bitenum_item **items)
{
    size_t i, bitmap_size = lyplg_type_bits_bitmap_size(type);
    uint32_t bit_pos;
    uint8_t bitmask;
    const uint8_t *byte;

    bit_pos = 0;
    for (i = 0; i < bitmap_size; ++i) {
        /* check this byte (but not necessarily all bits in the last byte) */
        byte = (uint8_t *)BITS_BITMAP_BYTE(bitmap, bitmap_size, i);
        for (bitmask = 1; bitmask; bitmask <<= 1) {
            if (*byte & bitmask) {
                /* add this bit */
                bits_add_item(bit_pos, type, items);
            }

            if (bit_pos == BITS_LAST_BIT_POSITION(type)) {
                /* we have checked the last valid bit */
                break;
            }

            ++bit_pos;
        }
    }
}